

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall
QMdiAreaPrivate::scrollBarPolicyChanged
          (QMdiAreaPrivate *this,Orientation orientation,ScrollBarPolicy policy)

{
  long lVar1;
  Data *pDVar2;
  bool bVar3;
  QPointer<QMdiSubWindow> *pQVar4;
  QObject *child;
  QPointer<QMdiSubWindow> *pQVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->childWindows).d.size;
  if (lVar1 == 0) goto LAB_004416a3;
  local_50.d = (this->childWindows).d.d;
  pQVar4 = (this->childWindows).d.ptr;
  local_50.ptr = pQVar4;
  local_50.size = lVar1;
  if (local_50.d == (Data *)0x0) {
LAB_00441639:
    pQVar5 = pQVar4 + lVar1;
    do {
      pDVar2 = (pQVar4->wp).d;
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        child = (QObject *)0x0;
      }
      else {
        child = (pQVar4->wp).value;
      }
      bVar3 = sanityCheck((QMdiSubWindow *)child,"QMdiArea::scrollBarPolicyChanged");
      if (bVar3) {
        QMdiSubWindow::setOption
                  ((QMdiSubWindow *)child,(orientation != Horizontal) + AllowOutsideAreaHorizontally
                   ,policy != ScrollBarAlwaysOff);
      }
      pQVar4 = pQVar4 + 1;
    } while (pQVar4 != pQVar5);
  }
  else {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (lVar1 != 0) goto LAB_00441639;
  }
  updateScrollBars(this);
  QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_50);
LAB_004416a3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::scrollBarPolicyChanged(Qt::Orientation orientation, Qt::ScrollBarPolicy policy)
{
    if (childWindows.isEmpty())
        return;

    const QMdiSubWindow::SubWindowOption option = orientation == Qt::Horizontal ?
        QMdiSubWindow::AllowOutsideAreaHorizontally : QMdiSubWindow::AllowOutsideAreaVertically;
    const bool enable = policy != Qt::ScrollBarAlwaysOff;
    // Take a copy because child->setOption() may indirectly call QCoreApplication::sendEvent(),
    // the latter could call unknown code that could e.g. recurse into the class
    // modifying childWindows.
    const auto subWindows = childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::scrollBarPolicyChanged"))
            continue;
        child->setOption(option, enable);
    }
    updateScrollBars();
}